

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O3

bool __thiscall FString::IsInt(FString *this)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  bVar3 = *this->Chars;
  pbVar5 = (byte *)this->Chars;
  while( true ) {
    if (bVar3 == 0) {
      return false;
    }
    pbVar4 = pbVar5 + 1;
    iVar2 = isspace((uint)bVar3);
    if (iVar2 == 0) break;
    bVar3 = *pbVar4;
    pbVar5 = pbVar4;
  }
  if ((bVar3 == 0x2b) || (bVar3 == 0x2d)) {
    bVar3 = *pbVar4;
    pbVar5 = pbVar4;
  }
  if (bVar3 == 0x30) {
    if ((pbVar5[1] & 0xf8) == 0x30) {
      pbVar5 = pbVar5 + 1;
      do {
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      } while ((bVar3 & 0xf8) == 0x30);
    }
    else {
      if ((pbVar5[1] & 0xdf) != 0x58) {
        return false;
      }
      pbVar5 = pbVar5 + 2;
      bVar1 = false;
      while ((bVar3 = *pbVar5, (byte)(bVar3 - 0x30) < 10 ||
             ((bVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0)))
             )) {
        pbVar5 = pbVar5 + 1;
        bVar1 = true;
      }
      if (!bVar1) {
        return false;
      }
    }
  }
  else {
    if (8 < (byte)(bVar3 - 0x31)) {
      return false;
    }
    do {
      bVar3 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
    } while ((byte)(bVar3 - 0x30) < 10);
  }
  if (bVar3 == 0) {
    bVar1 = true;
  }
  else {
    do {
      pbVar5 = pbVar5 + 1;
      iVar2 = isspace((uint)bVar3);
      bVar1 = iVar2 != 0;
      if (iVar2 == 0) {
        return bVar1;
      }
      bVar3 = *pbVar5;
    } while (bVar3 != 0);
  }
  return bVar1;
}

Assistant:

bool FString::IsInt () const
{
	// String must match: [whitespace] [{+ | �}] [0 [{ x | X }]] [digits] [whitespace]

/* This state machine is based on a simplification of re2c's output for this input:
digits		= [0-9];
hexdigits	= [0-9a-fA-F];
octdigits	= [0-7];

("0" octdigits+ | "0" [xX] hexdigits+ | (digits \ '0') digits*) { return true; }
[\000-\377] { return false; }*/
	const char *YYCURSOR = Chars;
	char yych;

	yych = *YYCURSOR;

	// Skip preceding whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }

	// Check for sign
	if (yych == '+' || yych == '-') { yych = *++YYCURSOR; }

	if (yych == '0')
	{
		yych = *++YYCURSOR;
		if (yych >= '0' && yych <= '7')
		{
			do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '7');
		}
		else if (yych == 'X' || yych == 'x')
		{
			bool gothex = false;
			yych = *++YYCURSOR;
			while ((yych >= '0' && yych <= '9') || (yych >= 'A' && yych <= 'F') || (yych >= 'a' && yych <= 'f'))
			{
				gothex = true;
				yych = *++YYCURSOR;
			}
			if (!gothex) return false;
		}
		else
		{
			return false;
		}
	}
	else if (yych >= '1' && yych <= '9')
	{
		do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '9');
	}
	else
	{
		return false;
	}

	// The rest should all be whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }
	return yych == '\0';
}